

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_compile_augment(lysc_ctx *ctx,lysp_node_augment *aug_p,lysc_node *target)

{
  uint32_t uVar1;
  ly_ctx *plVar2;
  lysc_node_action **pplVar3;
  char *pcVar4;
  lysc_node_notif **pplVar5;
  void *local_d8;
  char *local_b8;
  long local_a8;
  long local_90;
  long local_80;
  void *local_60;
  void *local_58;
  long *local_40;
  char *p__;
  uint64_t __u;
  ly_bool local_26;
  ly_bool local_25;
  uint32_t opt_prev;
  ly_bool child_unres_disabled;
  ly_bool enabled;
  lysc_node *plStack_20;
  LY_ERR rc;
  lysc_node *target_local;
  lysp_node_augment *aug_p_local;
  lysc_ctx *ctx_local;
  
  opt_prev = 0;
  local_26 = '\0';
  uVar1 = ctx->compile_opts;
  plStack_20 = target;
  target_local = (lysc_node *)aug_p;
  aug_p_local = (lysp_node_augment *)ctx;
  if ((target->nodetype & 0x3493) == 0) {
    __assert_fail("target->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_CHOICE | LYS_CASE | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                  ,0x7ef,
                  "LY_ERR lys_compile_augment(struct lysc_ctx *, struct lysp_node_augment *, struct lysc_node *)"
                 );
  }
  if ((aug_p->actions == (lysp_node_action *)0x0) ||
     (pplVar3 = lysc_node_actions_p(target), pplVar3 != (lysc_node_action **)0x0)) {
    if ((target_local[1].module == (lys_module *)0x0) ||
       (pplVar5 = lysc_node_notifs_p(plStack_20), pplVar5 != (lysc_node_notif **)0x0)) {
      opt_prev = lys_eval_iffeatures((ly_ctx *)(aug_p_local->field_0).node.parent,
                                     (lysp_qname *)target_local->dsc,&local_25);
      if (opt_prev == LY_SUCCESS) {
        if ((local_25 == '\0') && ((*(uint *)((long)&aug_p_local[1].field_0 + 0x2c) & 0xb) == 0)) {
          *(uint *)((long)&aug_p_local[1].field_0 + 0x2c) =
               *(uint *)((long)&aug_p_local[1].field_0 + 0x2c) | 2;
          local_26 = '\x01';
        }
        opt_prev = lys_compile_augment_children
                             ((lysc_ctx *)aug_p_local,(lysp_when *)target_local->priv,
                              *(uint16_t *)((long)&target_local->module + 2),
                              (lysp_node *)target_local->exts,plStack_20,local_26);
        if ((((opt_prev == LY_SUCCESS) &&
             (opt_prev = lys_compile_augment_children
                                   ((lysc_ctx *)aug_p_local,(lysp_when *)target_local->priv,
                                    *(uint16_t *)((long)&target_local->module + 2),
                                    *(lysp_node **)(target_local + 1),plStack_20,local_26),
             opt_prev == LY_SUCCESS)) &&
            (opt_prev = lys_compile_augment_children
                                  ((lysc_ctx *)aug_p_local,(lysp_when *)target_local->priv,
                                   *(uint16_t *)((long)&target_local->module + 2),
                                   (lysp_node *)target_local[1].module,plStack_20,local_26),
            opt_prev == LY_SUCCESS)) && (target_local->ref != (char *)0x0)) {
          if (plStack_20->exts == (lysc_ext_instance *)0x0) {
            local_60 = (void *)0x0;
          }
          else {
            if (plStack_20->exts == (lysc_ext_instance *)0x0) {
              local_58 = (void *)0x0;
            }
            else {
              local_58 = plStack_20->exts[-1].compiled;
            }
            local_60 = local_58;
          }
          if (plStack_20->exts == (lysc_ext_instance *)0x0) {
            if (target_local->ref == (char *)0x0) {
              local_90 = 0;
            }
            else {
              local_90 = *(long *)(target_local->ref + -8);
            }
            local_40 = (long *)calloc(1,((long)local_60 + local_90) * 0x48 + 8);
            if (local_40 == (long *)0x0) {
              ly_log((ly_ctx *)(aug_p_local->field_0).node.parent,LY_LLERR,LY_EMEM,
                     "Memory allocation failed (%s()).","lys_compile_augment");
              opt_prev = 1;
              goto LAB_0017dc4d;
            }
          }
          else {
            if (target_local->ref == (char *)0x0) {
              local_80 = 0;
            }
            else {
              local_80 = *(long *)(target_local->ref + -8);
            }
            local_40 = (long *)realloc(&plStack_20->exts[-1].compiled,
                                       ((long)plStack_20->exts[-1].compiled +
                                       (long)local_60 + local_80) * 0x48 + 8);
            if (local_40 == (long *)0x0) {
              ly_log((ly_ctx *)(aug_p_local->field_0).node.parent,LY_LLERR,LY_EMEM,
                     "Memory allocation failed (%s()).","lys_compile_augment");
              opt_prev = 1;
              goto LAB_0017dc4d;
            }
          }
          plStack_20->exts = (lysc_ext_instance *)(local_40 + 1);
          if (plStack_20->exts != (lysc_ext_instance *)0x0) {
            if (target_local->ref == (char *)0x0) {
              local_a8 = 0;
            }
            else {
              local_a8 = *(long *)(target_local->ref + -8);
            }
            memset(plStack_20->exts + *local_40,0,((long)local_60 + local_a8) * 0x48);
          }
          p__ = (char *)0x0;
          while( true ) {
            if (target_local->ref == (char *)0x0) {
              local_b8 = (char *)0x0;
            }
            else {
              local_b8 = *(char **)(target_local->ref + -8);
            }
            if (local_b8 <= p__) break;
            plStack_20->exts[-1].compiled = (void *)((long)plStack_20->exts[-1].compiled + 1);
            if (plStack_20->exts == (lysc_ext_instance *)0x0) {
              local_d8 = (void *)0x0;
            }
            else {
              local_d8 = plStack_20->exts[-1].compiled;
            }
            opt_prev = lys_compile_ext((lysc_ctx *)aug_p_local,
                                       (lysp_ext_instance *)(target_local->ref + (long)p__ * 0x70),
                                       plStack_20->exts + (long)local_d8 + -1,plStack_20);
            if (opt_prev == LY_ENOT) {
              plStack_20->exts[-1].compiled = (void *)((long)plStack_20->exts[-1].compiled + -1);
              opt_prev = 0;
            }
            else if (opt_prev != LY_SUCCESS) break;
            p__ = p__ + 1;
          }
        }
      }
    }
    else {
      plVar2 = (ly_ctx *)(aug_p_local->field_0).node.parent;
      pcVar4 = lys_nodetype2str(plStack_20->nodetype);
      ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
              "Invalid augment of %s node which is not allowed to contain notification node \"%s\"."
              ,pcVar4,(target_local[1].module)->ns);
      opt_prev = 7;
    }
  }
  else {
    plVar2 = (ly_ctx *)(aug_p_local->field_0).node.parent;
    pcVar4 = lys_nodetype2str(plStack_20->nodetype);
    ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
            "Invalid augment of %s node which is not allowed to contain RPC/action node \"%s\".",
            pcVar4,*(undefined8 *)(*(long *)(target_local + 1) + 0x18));
    opt_prev = 7;
  }
LAB_0017dc4d:
  *(uint32_t *)((long)&aug_p_local[1].field_0 + 0x2c) = uVar1;
  return opt_prev;
}

Assistant:

static LY_ERR
lys_compile_augment(struct lysc_ctx *ctx, struct lysp_node_augment *aug_p, struct lysc_node *target)
{
    LY_ERR rc = LY_SUCCESS;
    ly_bool enabled, child_unres_disabled = 0;
    uint32_t opt_prev = ctx->compile_opts;

    assert(target->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_CHOICE | LYS_CASE | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));

    /* nodetype checks */
    if (aug_p->actions && !lysc_node_actions_p(target)) {
        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                "Invalid augment of %s node which is not allowed to contain RPC/action node \"%s\".",
                lys_nodetype2str(target->nodetype), aug_p->actions->name);
        rc = LY_EVALID;
        goto cleanup;
    }
    if (aug_p->notifs && !lysc_node_notifs_p(target)) {
        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                "Invalid augment of %s node which is not allowed to contain notification node \"%s\".",
                lys_nodetype2str(target->nodetype), aug_p->notifs->name);
        rc = LY_EVALID;
        goto cleanup;
    }

    /* augment if-features */
    LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, aug_p->iffeatures, &enabled), cleanup);
    if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
        ctx->compile_opts |= LYS_COMPILE_DISABLED;
        child_unres_disabled = 1;
    }

    /* augment children */
    rc = lys_compile_augment_children(ctx, aug_p->when, aug_p->flags, aug_p->child, target, child_unres_disabled);
    LY_CHECK_GOTO(rc, cleanup);

    /* augment actions */
    rc = lys_compile_augment_children(ctx, aug_p->when, aug_p->flags, (struct lysp_node *)aug_p->actions, target,
            child_unres_disabled);
    LY_CHECK_GOTO(rc, cleanup);

    /* augment notifications */
    rc = lys_compile_augment_children(ctx, aug_p->when, aug_p->flags, (struct lysp_node *)aug_p->notifs, target,
            child_unres_disabled);
    LY_CHECK_GOTO(rc, cleanup);

    /* compile extensions into the target */
    COMPILE_EXTS_GOTO(ctx, aug_p->exts, target->exts, target, rc, cleanup);

cleanup:
    ctx->compile_opts = opt_prev;
    return rc;
}